

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

vm_obj_id_t CVmDynamicFunc::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t macros;
  vm_obj_id_t locals;
  
  if (argc - 5 < 0xfffffffc) {
    err_throw(0x899);
  }
  locals = 0;
  vVar1 = 0;
  macros = 0;
  if (1 < argc) {
    locals = 0;
    if (sp_[-2].typ != VM_NIL) {
      if (sp_[-2].typ != VM_OBJ) goto LAB_00279ea6;
      vVar1 = sp_[-2].val.obj;
    }
    if (argc == 2) {
      macros = 0;
      goto LAB_00279e80;
    }
    macros = 0;
    locals = 0;
    if (sp_[-3].typ != VM_NIL) {
      if (sp_[-3].typ != VM_OBJ) goto LAB_00279ea6;
      locals = sp_[-3].val.obj;
    }
    if ((3 < argc) && (sp_[-4].typ != VM_NIL)) {
      if (sp_[-4].typ != VM_OBJ) {
LAB_00279ea6:
        err_throw(0x900);
      }
      macros = sp_[-4].val.obj;
    }
  }
LAB_00279e80:
  vVar1 = create(0,vVar1,locals,macros,sp_ + -1);
  sp_ = sp_ + -(ulong)argc;
  return vVar1;
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* check arguments */
    if (argc < 1 || argc > 4)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* get the source code argument (leave on stack for gc protection) */
    const vm_val_t *src = G_stk->get(0);

    /* get the global symbol table object, if any */
    vm_obj_id_t globals = VM_INVALID_OBJ;
    if (argc >= 2)
    {
        /* it has to be an object or nil */
        if (G_stk->get(1)->typ == VM_OBJ)
            globals = G_stk->get(1)->val.obj;
        else if (G_stk->get(1)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* get the local symbol table object, if any */
    vm_obj_id_t locals = VM_INVALID_OBJ;
    if (argc >= 3)
    {
        /* it has to be an object or nil */
        if (G_stk->get(2)->typ == VM_OBJ)
            locals = G_stk->get(2)->val.obj;
        else if (G_stk->get(2)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* check for macros */
    vm_obj_id_t macros = VM_INVALID_OBJ;
    if (argc >= 4)
    {
        /* it has to be an object or nil */
        if (G_stk->get(3)->typ == VM_OBJ)
            macros = G_stk->get(3)->val.obj;
        else if (G_stk->get(3)->typ != VM_NIL)
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* allocate the object ID and create the object */
    vm_obj_id_t id = create(vmg_ FALSE, globals, locals, macros, src);

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}